

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  ulong *puVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int b;
  int a;
  int n;
  size_t k;
  vector<int> v;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  vector<int> local_60;
  
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_6c);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&local_70);
  puVar2 = (ulong *)std::istream::operator>>(piVar1,&local_74);
  std::istream::_M_extract<unsigned_long>(puVar2);
  CP::vector<int>::vector(&local_60,(long)local_6c);
  lVar4 = local_60.oCount + 1;
  for (lVar5 = 0; lVar5 < local_6c; lVar5 = lVar5 + 1) {
    local_60.oCount = lVar4 + lVar5;
    local_60.mData[lVar5] = (int)lVar5;
  }
  std::_V2::__rotate<int*>
            (local_60.mData + local_70,local_60.mData + local_70 + local_68,
             local_60.mData + local_74);
  for (lVar4 = 0; local_60.mSize << 2 != lVar4; lVar4 = lVar4 + 4) {
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,*(int *)((long)local_60.mData + lVar4));
    std::operator<<(poVar3," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  CP::vector<int>::~vector(&local_60);
  return 0;
}

Assistant:

int main() {
  int n,a,b;
  size_t k;
  cin >> n >> a >> b >> k;
  CP::vector<int> v(n);
  for (int i = 0;i < n;i++) v[i] = i;
  v.rotate(v.begin() + a, v.begin() + b,k);
  for (auto &x : v) cout << x << " ";
  cout << endl;
}